

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool __thiscall
tinyobj::MaterialStreamReader::operator()
          (MaterialStreamReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  ulong uVar1;
  ostream *this_00;
  string local_1f8 [48];
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [376];
  string *local_40;
  string *err_local;
  string *warn_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *matMap_local;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials_local;
  string *matId_local;
  MaterialStreamReader *this_local;
  
  local_40 = err;
  err_local = warn;
  warn_local = (string *)matMap;
  matMap_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)materials;
  materials_local = (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)matId;
  matId_local = (string *)this;
  uVar1 = std::ios::operator!((ios *)(this->m_inStream +
                                     *(long *)(*(long *)this->m_inStream + -0x18)));
  if ((uVar1 & 1) == 0) {
    LoadMtl((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)warn_local,
            (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)matMap_local,
            this->m_inStream,err_local,local_40);
    this_local._7_1_ = 1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1c8);
    this_00 = std::operator<<(local_1b8,"Material stream in error state. ");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    if (err_local != (string *)0x0) {
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)err_local,local_1f8);
      std::__cxx11::string::~string(local_1f8);
    }
    this_local._7_1_ = 0;
    std::__cxx11::stringstream::~stringstream(local_1c8);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MaterialStreamReader::operator()(const std::string &matId,
                                      std::vector<material_t> *materials,
                                      std::map<std::string, int> *matMap,
                                      std::string *warn, std::string *err) {
  (void)err;
  (void)matId;
  if (!m_inStream) {
    std::stringstream ss;
    ss << "Material stream in error state. " << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;
  }

  LoadMtl(matMap, materials, &m_inStream, warn, err);

  return true;
}